

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blanczos.cpp
# Opt level: O0

uint32_t blanczos(uint32_t *B,uint64_t N,uint32_t Nrow,uint32_t Ncol,uint64_t *result)

{
  bool bVar1;
  uint32_t uVar2;
  uint *puVar3;
  ostream *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference puVar4;
  uint in_ECX;
  int in_EDX;
  uint64_t *elem;
  iterator __end2;
  iterator __begin2;
  vec64 *__range2;
  vec64 X;
  uniform_int_distribution<unsigned_long> dis;
  mt19937_64 gen;
  random_device rd;
  uint32_t Nsol;
  sparse matrix;
  double cache;
  uint32_t nthreads;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffe148;
  undefined4 in_stack_ffffffffffffe150;
  undefined4 in_stack_ffffffffffffe154;
  ostream *in_stack_ffffffffffffe158;
  undefined4 in_stack_ffffffffffffe160;
  uint32_t in_stack_ffffffffffffe164;
  result_type in_stack_ffffffffffffe168;
  undefined4 in_stack_ffffffffffffe180;
  undefined4 in_stack_ffffffffffffe184;
  undefined8 in_stack_ffffffffffffe188;
  iterator in_stack_ffffffffffffe190;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffe198;
  sparse *in_stack_ffffffffffffe1a0;
  uint32_t in_stack_fffffffffffff7f4;
  uint64_t *in_stack_fffffffffffff7f8;
  vec64 *in_stack_fffffffffffff800;
  sparse *in_stack_fffffffffffff808;
  uint32_t local_bc;
  sparse local_b8;
  undefined8 local_38;
  uint local_2c [5];
  uint local_18;
  int local_14;
  
  local_2c[1] = 1;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_2c[0] = std::thread::hardware_concurrency();
  puVar3 = std::max<unsigned_int>(local_2c + 1,local_2c);
  local_2c[2] = *puVar3;
  local_38 = 0x4120000000000000;
  if (local_18 < local_14 + 0x40U) {
    this = std::operator<<((ostream *)&std::cerr,"Ncol >= Nrow + 64 is expected.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(0x11);
  }
  __blanczos_matrix::sparse::sparse
            (in_stack_ffffffffffffe1a0,(uint32_t *)in_stack_ffffffffffffe198._M_current,
             (uint64_t)in_stack_ffffffffffffe190._M_current,
             (uint32_t)((ulong)in_stack_ffffffffffffe188 >> 0x20),
             (uint32_t)in_stack_ffffffffffffe188,
             (double)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180));
  local_bc = 0xffffffff;
  while (local_bc == 0xffffffff) {
    std::random_device::random_device((random_device *)in_stack_ffffffffffffe190._M_current);
    std::random_device::operator()((random_device *)0x11327d);
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)CONCAT44(in_stack_ffffffffffffe154,in_stack_ffffffffffffe150),
               (result_type)in_stack_ffffffffffffe148);
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffe154,in_stack_ffffffffffffe150),
               (unsigned_long)in_stack_ffffffffffffe148,0x1132b2);
    uVar2 = __blanczos_matrix::sparse::Kcol(&local_b8);
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(ulong)uVar2;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1132ea);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (this_00,in_stack_ffffffffffffe168,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffe164,in_stack_ffffffffffffe160)
               ,(allocator_type *)in_stack_ffffffffffffe158);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x11330f);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffe148);
    in_stack_ffffffffffffe190 =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffe148);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe154,in_stack_ffffffffffffe150),
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffe148);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&stack0xffffffffffffe198);
      in_stack_ffffffffffffe168 =
           std::uniform_int_distribution<unsigned_long>::operator()
                     ((uniform_int_distribution<unsigned_long> *)
                      CONCAT44(in_stack_ffffffffffffe154,in_stack_ffffffffffffe150),
                      in_stack_ffffffffffffe148);
      *puVar4 = in_stack_ffffffffffffe168;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&stack0xffffffffffffe198);
    }
    local_bc = anon_unknown.dwarf_9ebc::runner
                         (in_stack_fffffffffffff808,in_stack_fffffffffffff800,
                          in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4);
    in_stack_ffffffffffffe164 = local_bc;
    if (local_bc == 0xffffffff) {
      in_stack_ffffffffffffe158 = std::operator<<((ostream *)&std::cout,"Need to restart Lanczos.");
      std::ostream::operator<<(in_stack_ffffffffffffe158,std::endl<char,std::char_traits<char>>);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffe164,in_stack_ffffffffffffe160));
    std::random_device::~random_device((random_device *)0x11348d);
  }
  __blanczos_matrix::sparse::~sparse((sparse *)CONCAT44(local_bc,in_stack_ffffffffffffe150));
  return local_bc;
}

Assistant:

uint32_t blanczos(const uint32_t * B, const uint64_t N, const uint32_t Nrow, const uint32_t Ncol, uint64_t * result)
{
    const uint32_t nthreads = std::max(1U, std::thread::hardware_concurrency());
    constexpr double cache = 512.0 * 1024.0; // Blocks capped at 512 KB.

    if (Ncol < Nrow + 64U)
    {
        std::cerr << "Ncol >= Nrow + 64 is expected." << std::endl;
        exit(17);
    }

    const __blanczos_matrix::sparse matrix = __blanczos_matrix::sparse(B, N, Nrow, Ncol, cache);

    uint32_t Nsol = UINT32_MAX;
    while (Nsol == UINT32_MAX)
    {
        std::random_device rd;
        std::mt19937_64 gen(rd());
        std::uniform_int_distribution<uint64_t> dis(0U, UINT64_MAX);

        vec64 X = vec64(matrix.Kcol(), 0U);
        for (uint64_t & elem : X)
            elem = dis(gen);

        Nsol = runner(matrix, X, result, nthreads);
        if (Nsol == UINT32_MAX)
            std::cout << "Need to restart Lanczos." << std::endl;
    }
    return Nsol;
}